

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FOCC-OTA-cs16btech11038.cpp
# Opt level: O0

void __thiscall FOCC_OTA::garbageCollect(FOCC_OTA *this)

{
  type pTVar1;
  Transaction *this_00;
  bool bVar2;
  char cVar3;
  reference __in;
  type *__x;
  type *__x_00;
  reference piVar4;
  reference ppDVar5;
  reference piVar6;
  mapped_type *ppTVar7;
  int local_d4;
  _Node_iterator_base<int,_false> _Stack_d0;
  int e;
  iterator __end1_1;
  iterator __begin1_1;
  unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> *__range1_1;
  iterator iStack_a0;
  int i;
  iterator __end2;
  iterator __begin2;
  set<int,_std::less<int>,_std::allocator<int>_> *__range2;
  type *v;
  type *k;
  _Self local_60;
  iterator __end1;
  iterator __begin1;
  map<int,_Transaction_*,_std::less<int>,_std::allocator<std::pair<const_int,_Transaction_*>_>_>
  *__range1;
  unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> freeables;
  FOCC_OTA *this_local;
  
  freeables._M_h._M_single_bucket = (__node_base_ptr)this;
  memset(&__range1,0,0x38);
  std::unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>::unordered_set
            ((unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> *)
             &__range1);
  __end1 = std::
           map<int,_Transaction_*,_std::less<int>,_std::allocator<std::pair<const_int,_Transaction_*>_>_>
           ::begin(&this->transactions);
  local_60._M_node =
       (_Base_ptr)
       std::
       map<int,_Transaction_*,_std::less<int>,_std::allocator<std::pair<const_int,_Transaction_*>_>_>
       ::end(&this->transactions);
  while (bVar2 = std::operator!=(&__end1,&local_60), bVar2) {
    __in = std::_Rb_tree_iterator<std::pair<const_int,_Transaction_*>_>::operator*(&__end1);
    __x = std::get<0ul,int_const,Transaction*>(__in);
    __x_00 = std::get<1ul,int_const,Transaction*>(__in);
    cVar3 = Transaction::getStatus(*__x_00);
    if (cVar3 != 's') {
      pTVar1 = *__x_00;
      __end2 = std::set<int,_std::less<int>,_std::allocator<int>_>::begin(&pTVar1->readSet);
      iStack_a0 = std::set<int,_std::less<int>,_std::allocator<int>_>::end(&pTVar1->readSet);
      while (bVar2 = std::operator!=(&__end2,&stack0xffffffffffffff60), bVar2) {
        piVar4 = std::_Rb_tree_const_iterator<int>::operator*(&__end2);
        ppDVar5 = std::vector<DataItem_*,_std::allocator<DataItem_*>_>::operator[]
                            (&this->dataItems,(long)*piVar4);
        std::set<Transaction_*,_TransCompare,_std::allocator<Transaction_*>_>::erase
                  (&(*ppDVar5)->read_list,__x_00);
        std::_Rb_tree_const_iterator<int>::operator++(&__end2);
      }
      std::unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>::insert
                ((unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> *)
                 &__range1,__x);
    }
    std::_Rb_tree_iterator<std::pair<const_int,_Transaction_*>_>::operator++(&__end1);
  }
  __end1_1 = std::unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>::
             begin((unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> *)
                   &__range1);
  _Stack_d0._M_cur =
       (__node_type *)
       std::unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>::end
                 ((unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> *)
                  &__range1);
  while (bVar2 = std::__detail::operator!=
                           (&__end1_1.super__Node_iterator_base<int,_false>,&stack0xffffffffffffff30
                           ), bVar2) {
    piVar6 = std::__detail::_Node_iterator<int,_true,_false>::operator*(&__end1_1);
    local_d4 = *piVar6;
    ppTVar7 = std::
              map<int,_Transaction_*,_std::less<int>,_std::allocator<std::pair<const_int,_Transaction_*>_>_>
              ::operator[](&this->transactions,&local_d4);
    this_00 = *ppTVar7;
    if (this_00 != (Transaction *)0x0) {
      Transaction::~Transaction(this_00);
      operator_delete(this_00,0xc0);
    }
    std::
    map<int,_Transaction_*,_std::less<int>,_std::allocator<std::pair<const_int,_Transaction_*>_>_>::
    erase(&this->transactions,&local_d4);
    std::__detail::_Node_iterator<int,_true,_false>::operator++(&__end1_1);
  }
  std::unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>::~unordered_set
            ((unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> *)
             &__range1);
  return;
}

Assistant:

void FOCC_OTA::garbageCollect() {
    std::unordered_set<int> freeables{};

    for(auto& [k, v]: transactions){
        // dont need to process still ongoing transactions!
        if(v->getStatus()=='s') continue;

        // remove this transaction from any read_lists!
        for(auto i: v->readSet){
            dataItems[i]->read_list.erase(v);
        }

        // remove this transaction from the hashmap.
        //transactions.erase(k);
        freeables.insert(k);
    }

    for(auto e: freeables) {delete transactions[e];transactions.erase(e);}
}